

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O2

uint64_t __thiscall clunk::Node::QPerftSearch<false>(Node *this,int depth)

{
  int iVar1;
  long *plVar2;
  uint64_t uVar3;
  long lVar4;
  uint64_t uVar5;
  
  if (depth < 1) {
    GenerateMoves<false,true>(this,depth);
    plVar2 = (long *)(_stats + 0x38);
  }
  else {
    GenerateMoves<false,false>(this,depth);
    plVar2 = (long *)(_stats + 0x30);
  }
  lVar4 = (long)this->moveCount;
  *plVar2 = *plVar2 + lVar4;
  if (depth < 0 || (this->child == (Node *)0x0 || lVar4 == 0)) {
    uVar5 = lVar4 + 1;
  }
  else {
    uVar5 = 1;
    while (_stop == 0) {
      iVar1 = this->moveIndex;
      if (this->moveCount <= iVar1) {
        return uVar5;
      }
      this->moveIndex = iVar1 + 1;
      Exec<false>(this,this->moves + iVar1,this->child);
      uVar3 = QPerftSearch<true>(this->child,depth + -1);
      uVar5 = uVar5 + uVar3;
      Undo<false>(this,this->moves + iVar1);
    }
  }
  return uVar5;
}

Assistant:

uint64_t QPerftSearch(const int depth) {
    if (depth <= 0) {
      GenerateMoves<color, true>(depth);
      _stats.qnodes += moveCount;
    }
    else {
      GenerateMoves<color, false>(depth);
      _stats.snodes += moveCount;
    }
    if ((!child) | (!moveCount) | (depth < 0)) {
      return (moveCount + 1);
    }

    uint64_t count = 1;
    while (!_stop && (moveIndex < moveCount)) {
      const Move& move = moves[moveIndex++];
      Exec<color>(move, *child);
      count += child->QPerftSearch<!color>(depth - 1);
      Undo<color>(move);
    }
    return count;
  }